

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

Arguments * __thiscall Corrade::Utility::Arguments::addArrayArgument(Arguments *this,string *key)

{
  ulong uVar1;
  ostream *poVar2;
  Debug *pDVar3;
  Entry *pEVar4;
  size_t sVar5;
  size_t local_168;
  string local_160 [37];
  undefined1 local_13b;
  undefined1 local_13a [2];
  string local_138 [8];
  string helpKey;
  Error local_110;
  Flags local_e1;
  Error local_e0;
  Flags local_b1;
  Error local_b0;
  Flags local_81;
  Error local_80;
  Flags local_41;
  Error local_40;
  string *local_18;
  string *key_local;
  Arguments *this_local;
  
  local_18 = key;
  key_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Error::Error(&local_40,poVar2,local_41);
    pDVar3 = Debug::operator<<(&local_40.super_Debug,
                               "Utility::Arguments::addArrayArgument(): argument");
    pDVar3 = operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                       (pDVar3,key);
    Debug::operator<<(pDVar3,"not allowed in prefixed version");
    Error::~Error(&local_40);
    abort();
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_81);
    Error::Error(&local_80,poVar2,local_81);
    Debug::operator<<(&local_80.super_Debug,
                      "Utility::Arguments::addArrayArgument(): key can\'t be empty");
    Error::~Error(&local_80);
    abort();
  }
  pEVar4 = find(this,key);
  if (pEVar4 != (Entry *)0x0) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_b1);
    Error::Error(&local_b0,poVar2,local_b1);
    pDVar3 = Debug::operator<<(&local_b0.super_Debug,
                               "Utility::Arguments::addArrayArgument(): the key");
    pDVar3 = operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                       (pDVar3,key);
    Debug::operator<<(pDVar3,"is already used");
    Error::~Error(&local_b0);
    abort();
  }
  if (this->_arrayArgument != 0) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_e1);
    Error::Error(&local_e0,poVar2,local_e1);
    pDVar3 = Debug::operator<<(&local_e0.super_Debug,
                               "Utility::Arguments::addArrayArgument(): there\'s already an array argument"
                              );
    pEVar4 = Containers::
             Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
             ::operator[]<unsigned_short,_0>(&this->_entries,this->_arrayArgument);
    operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pDVar3,&pEVar4->key);
    Error::~Error(&local_e0);
    abort();
  }
  if (this->_finalOptionalArgument != 0) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> *)
               (helpKey.field_2._M_local_buf + 0xf));
    Error::Error(&local_110,poVar2,(Flags)helpKey.field_2._M_local_buf[0xf]);
    Debug::operator<<(&local_110.super_Debug,
                      "Utility::Arguments::addArrayArgument(): can\'t add more arguments after the final optional one"
                     );
    Error::~Error(&local_110);
    abort();
  }
  helpKey.field_2._M_local_buf[0xe] = (char)Utility::operator~(Parsed);
  Containers::EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)'\xff'>::operator&=
            (&this->_flags,
             (EnumSet<Corrade::Utility::Arguments::InternalFlag,_(unsigned_char)__xff_>)
             helpKey.field_2._M_local_buf[0xe]);
  sVar5 = Containers::
          Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
          ::size(&this->_entries);
  this->_arrayArgument = (uint16_t)sVar5;
  std::__cxx11::string::string(local_138,(string *)key);
  local_13a[0] = 1;
  local_13b = 0;
  std::__cxx11::string::string(local_160);
  local_168 = Containers::
              Array<Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>,_void_(*)(Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>_*,_unsigned_long)>
              ::size(&this->_arrayValues);
  Containers::
  arrayAppend<Corrade::Utility::Arguments::Entry,Corrade::Utility::Arguments::Type,char,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long>
            (&this->_entries,local_13a,&local_13b,key,local_138,local_160,&local_168);
  std::__cxx11::string::~string(local_160);
  Containers::
  arrayAppend<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>>
            (&this->_arrayValues);
  std::__cxx11::string::~string(local_138);
  return this;
}

Assistant:

Arguments& Arguments::addArrayArgument(std::string key) {
    CORRADE_ASSERT(_prefix.empty(),
        "Utility::Arguments::addArrayArgument(): argument" << key << "not allowed in prefixed version", *this);
    CORRADE_ASSERT(!key.empty(),
        "Utility::Arguments::addArrayArgument(): key can't be empty", *this);
    CORRADE_ASSERT(!find(key),
        "Utility::Arguments::addArrayArgument(): the key" << key << "is already used", *this);

    /* There can be only one array argument and thre can't be both an array
       argument and a final optional argument, as otherwise we would have no
       way to know what is what */
    CORRADE_ASSERT(!_arrayArgument,
        "Utility::Arguments::addArrayArgument(): there's already an array argument" << _entries[_arrayArgument].key, *this);
    CORRADE_ASSERT(!_finalOptionalArgument,
        "Utility::Arguments::addArrayArgument(): can't add more arguments after the final optional one", *this);

    /* Reset the parsed flag -- it's probably a mistake to add an argument and
       then ask for values without parsing again */
    _flags &= ~InternalFlag::Parsed;

    _arrayArgument = _entries.size();
    std::string helpKey = key;
    arrayAppend(_entries, InPlaceInit, Type::ArrayArgument, '\0', std::move(key), std::move(helpKey), std::string(), _arrayValues.size());
    arrayAppend(_arrayValues, InPlaceInit);
    return *this;
}